

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O0

int json_integer_option(lua_State *l,int optindex,int *setting,int min,int max)

{
  int iVar1;
  lua_Integer lVar2;
  char local_68 [4];
  int value;
  char errmsg [64];
  int max_local;
  int min_local;
  int *setting_local;
  int optindex_local;
  lua_State *l_local;
  
  errmsg._56_4_ = max;
  errmsg._60_4_ = min;
  iVar1 = lua_type(l,optindex);
  if (iVar1 != 0) {
    lVar2 = luaL_checkinteger(l,optindex);
    iVar1 = (int)lVar2;
    snprintf(local_68,0x40,"expected integer between %d and %d",(ulong)(uint)errmsg._60_4_,
             (ulong)(uint)errmsg._56_4_);
    if ((iVar1 < (int)errmsg._60_4_) || ((int)errmsg._56_4_ < iVar1)) {
      luaL_argerror(l,1,local_68);
    }
    *setting = iVar1;
  }
  lua_pushinteger(l,(long)*setting);
  return 1;
}

Assistant:

static int json_integer_option(lua_State *l, int optindex, int *setting,
                               int min, int max)
{
    char errmsg[64];
    int value;

    if (!lua_isnil(l, optindex)) {
        value = luaL_checkinteger(l, optindex);
        snprintf(errmsg, sizeof(errmsg), "expected integer between %d and %d", min, max);
        luaL_argcheck(l, min <= value && value <= max, 1, errmsg);
        *setting = value;
    }

    lua_pushinteger(l, *setting);

    return 1;
}